

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

expansion * __thiscall
GEO::expansion::assign_sum(expansion *this,expansion *a,expansion *b,expansion *c,expansion *d)

{
  long lVar1;
  expansion *peVar2;
  expansion *peVar3;
  index_t iVar4;
  size_t sVar5;
  expansion *peVar6;
  expansion *peVar7;
  double dStack_60;
  expansion *local_58;
  expansion *local_50;
  expansion *local_48;
  expansion *local_40;
  expansion *cd;
  expansion *ab;
  expansion *d_local;
  expansion *c_local;
  expansion *b_local;
  expansion *a_local;
  expansion *this_local;
  
  dStack_60 = 9.0828287232986e-318;
  local_48 = this;
  ab = d;
  d_local = c;
  c_local = b;
  b_local = a;
  a_local = this;
  iVar4 = sum_capacity(a,b);
  dStack_60 = 9.08286330789381e-318;
  sVar5 = bytes(iVar4);
  peVar3 = b_local;
  peVar2 = c_local;
  lVar1 = -(sVar5 + 0xf & 0xfffffffffffffff0);
  local_58 = (expansion *)((long)&local_58 + lVar1);
  *(undefined8 *)((long)&dStack_60 + lVar1) = 0x1c0d5d;
  iVar4 = sum_capacity(peVar3,peVar2);
  peVar2 = local_58;
  *(undefined8 *)((long)&dStack_60 + lVar1) = 0x1c0d68;
  expansion(peVar2,iVar4);
  peVar7 = b_local;
  peVar3 = c_local;
  peVar2 = local_58;
  *(undefined8 *)((long)&dStack_60 + lVar1) = 0x1c0d79;
  cd = assign_sum(peVar2,peVar7,peVar3);
  peVar3 = d_local;
  peVar2 = ab;
  *(undefined8 *)((long)&dStack_60 + lVar1) = 0x1c0d8a;
  iVar4 = sum_capacity(peVar3,peVar2);
  *(undefined8 *)((long)&dStack_60 + lVar1) = 0x1c0d91;
  sVar5 = bytes(iVar4);
  peVar3 = d_local;
  peVar2 = ab;
  peVar6 = (expansion *)(((long)&local_58 + lVar1) - (sVar5 + 0xf & 0xfffffffffffffff0));
  local_50 = peVar6;
  peVar6[-1].x_[1] = 9.08348583060757e-318;
  iVar4 = sum_capacity(peVar3,peVar2);
  peVar2 = local_50;
  peVar6[-1].x_[1] = 9.08354017782861e-318;
  expansion(peVar2,iVar4);
  peVar7 = d_local;
  peVar3 = ab;
  peVar2 = local_50;
  peVar6[-1].x_[1] = 9.0836241689884e-318;
  peVar7 = assign_sum(peVar2,peVar7,peVar3);
  peVar3 = cd;
  peVar2 = local_48;
  local_40 = peVar7;
  peVar6[-1].x_[1] = 9.08372792277403e-318;
  assign_sum(peVar2,peVar3,peVar7);
  return local_48;
}

Assistant:

expansion& expansion::assign_sum(
        const expansion& a, const expansion& b,
        const expansion& c, const expansion& d
    ) {
        geo_debug_assert(capacity() >= sum_capacity(a, b, c));
        expansion& ab = expansion_sum(a, b);
        expansion& cd = expansion_sum(c, d);
        this->assign_sum(ab, cd);
        return *this;
    }